

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcResub.c
# Opt level: O0

Dec_Graph_t * Abc_ManResubQuit1(Abc_Obj_t *pRoot,Abc_Obj_t *pObj0,Abc_Obj_t *pObj1,int fOrGate)

{
  int iVar1;
  Dec_Edge_t eEdge0;
  Dec_Edge_t eEdge1;
  Dec_Graph_t *pGraph_00;
  Dec_Node_t *pDVar2;
  Dec_Edge_t eNode1;
  Dec_Edge_t eNode0;
  Dec_Edge_t eRoot;
  Dec_Graph_t *pGraph;
  int fOrGate_local;
  Abc_Obj_t *pObj1_local;
  Abc_Obj_t *pObj0_local;
  Abc_Obj_t *pRoot_local;
  
  if (pObj0 == pObj1) {
    __assert_fail("pObj0 != pObj1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcResub.c"
                  ,0x28d,
                  "Dec_Graph_t *Abc_ManResubQuit1(Abc_Obj_t *, Abc_Obj_t *, Abc_Obj_t *, int)");
  }
  iVar1 = Abc_ObjIsComplement(pObj0);
  if (iVar1 == 0) {
    iVar1 = Abc_ObjIsComplement(pObj1);
    if (iVar1 == 0) {
      pGraph_00 = Dec_GraphCreate(2);
      pDVar2 = Dec_GraphNode(pGraph_00,0);
      (pDVar2->field_2).pFunc = pObj0;
      pDVar2 = Dec_GraphNode(pGraph_00,1);
      (pDVar2->field_2).pFunc = pObj1;
      eEdge0 = Dec_EdgeCreate(0,*(uint *)&pObj0->field_0x14 >> 7 & 1);
      eEdge1 = Dec_EdgeCreate(1,*(uint *)&pObj1->field_0x14 >> 7 & 1);
      if (fOrGate == 0) {
        eNode1 = Dec_GraphAddNodeAnd(pGraph_00,eEdge0,eEdge1);
      }
      else {
        eNode1 = Dec_GraphAddNodeOr(pGraph_00,eEdge0,eEdge1);
      }
      Dec_GraphSetRoot(pGraph_00,eNode1);
      if ((*(uint *)&pRoot->field_0x14 >> 7 & 1) != 0) {
        Dec_GraphComplement(pGraph_00);
      }
      return pGraph_00;
    }
    __assert_fail("!Abc_ObjIsComplement(pObj1)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcResub.c"
                  ,0x28f,
                  "Dec_Graph_t *Abc_ManResubQuit1(Abc_Obj_t *, Abc_Obj_t *, Abc_Obj_t *, int)");
  }
  __assert_fail("!Abc_ObjIsComplement(pObj0)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcResub.c"
                ,0x28e,"Dec_Graph_t *Abc_ManResubQuit1(Abc_Obj_t *, Abc_Obj_t *, Abc_Obj_t *, int)")
  ;
}

Assistant:

Dec_Graph_t * Abc_ManResubQuit1( Abc_Obj_t * pRoot, Abc_Obj_t * pObj0, Abc_Obj_t * pObj1, int fOrGate )
{
    Dec_Graph_t * pGraph;
    Dec_Edge_t eRoot, eNode0, eNode1;
    assert( pObj0 != pObj1 );
    assert( !Abc_ObjIsComplement(pObj0) );
    assert( !Abc_ObjIsComplement(pObj1) );
    pGraph = Dec_GraphCreate( 2 );
    Dec_GraphNode( pGraph, 0 )->pFunc = pObj0;
    Dec_GraphNode( pGraph, 1 )->pFunc = pObj1;
    eNode0 = Dec_EdgeCreate( 0, pObj0->fPhase );
    eNode1 = Dec_EdgeCreate( 1, pObj1->fPhase );
    if ( fOrGate ) 
        eRoot  = Dec_GraphAddNodeOr( pGraph, eNode0, eNode1 );
    else
        eRoot  = Dec_GraphAddNodeAnd( pGraph, eNode0, eNode1 );
    Dec_GraphSetRoot( pGraph, eRoot );
    if ( pRoot->fPhase )
        Dec_GraphComplement( pGraph );
    return pGraph;
}